

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * xmlTextReaderBaseUri(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlChar *ret;
  xmlChar *local_10;
  
  local_10 = (xmlChar *)0x0;
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNode *)0x0)) {
    local_10 = (xmlChar *)0x0;
  }
  else {
    iVar1 = xmlNodeGetBaseSafe((xmlDoc *)0x0,reader->node,&local_10);
    if (iVar1 < 0) {
      xmlTextReaderErrMemory(reader);
    }
  }
  return local_10;
}

Assistant:

xmlChar *
xmlTextReaderBaseUri(xmlTextReaderPtr reader) {
    xmlChar *ret = NULL;
    int result;

    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    result = xmlNodeGetBaseSafe(NULL, reader->node, &ret);
    if (result < 0)
        xmlTextReaderErrMemory(reader);

    return(ret);
}